

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O0

void __thiscall
Test::HTMLOutput::generate(HTMLOutput *this,ostream *stream,bool includePassed,string *title)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pSVar4;
  reference suite;
  __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
  local_38;
  __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
  local_30;
  iterator suiteInfo;
  string *title_local;
  bool includePassed_local;
  ostream *stream_local;
  HTMLOutput *this_local;
  
  suiteInfo._M_current = (SuiteInfo *)title;
  generateHeader(this,stream,title);
  std::operator<<(stream,"<body>");
  generateSuitesTable(this,stream,includePassed);
  poVar3 = std::operator<<(stream,"<br>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_30._M_current =
       (SuiteInfo *)
       std::
       vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>::
       begin((vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
              *)(this + 8));
  do {
    local_38._M_current =
         (SuiteInfo *)
         std::
         vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
         ::end((vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
                *)(this + 8));
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) {
      poVar3 = std::operator<<(stream,"</body></html>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      return;
    }
    if (includePassed) {
LAB_00163d72:
      suite = __gnu_cxx::
              __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
              ::operator*(&local_30);
      generateTestsTable(this,stream,suite,includePassed);
      poVar3 = std::operator<<(stream,"<br>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_30);
      uVar1 = pSVar4->numTests;
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_30);
      if (uVar1 != pSVar4->numPositiveTests) goto LAB_00163d72;
    }
    __gnu_cxx::
    __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

void HTMLOutput::generate(std::ostream &stream, bool includePassed, const std::string &title) {
  // 1. print header (including style-information)
  generateHeader(stream, title);
  stream << "<body>";
  // 2. print table
  generateSuitesTable(stream, includePassed);
  stream << "<br>" << std::endl;
  auto suiteInfo = suites.begin();
  while (suiteInfo != suites.end()) {
    if (includePassed || suiteInfo->numTests != suiteInfo->numPositiveTests) {
      generateTestsTable(stream, *suiteInfo, includePassed);
      stream << "<br>" << std::endl;
    }
    ++suiteInfo;
  }
  stream << "</body></html>" << std::endl;
  // flush all data to the stream
  stream.flush();
}